

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.h
# Opt level: O0

void __thiscall CivetHandler::CivetHandler(CivetHandler *this)

{
  CivetHandler *this_local;
  
  this->_vptr_CivetHandler = (_func_int **)&PTR__CivetHandler_0019b900;
  return;
}

Assistant:

class CIVETWEB_CXX_API CivetHandler
{
  public:
	/**
	 * Destructor
	 */
	virtual ~CivetHandler()
	{
	}

	/**
	 * Callback method for GET request.
	 *
	 * @param server - the calling server
	 * @param conn - the connection information
	 * @returns true if implemented, false otherwise
	 */
	virtual bool handleGet(CivetServer *server, struct mg_connection *conn);

	/**
	 * Callback method for GET request.
	 *
	 * @param server - the calling server
	 * @param conn - the connection information
	 * @param status_code - pointer to return status code
	 * @returns true if implemented, false otherwise
	 */
	virtual bool handleGet(CivetServer *server,
	                       struct mg_connection *conn,
	                       int *status_code);

	/**
	 * Callback method for POST request.
	 *
	 * @param server - the calling server
	 * @param conn - the connection information
	 * @returns true if implemented, false otherwise
	 */
	virtual bool handlePost(CivetServer *server, struct mg_connection *conn);

	/**
	 * Callback method for POST request.
	 *
	 * @param server - the calling server
	 * @param conn - the connection information
	 * @param status_code - pointer to return status code
	 * @returns true if implemented, false otherwise
	 */
	virtual bool handlePost(CivetServer *server,
	                        struct mg_connection *conn,
	                        int *status_code);

	/**
	 * Callback method for HEAD request.
	 *
	 * @param server - the calling server
	 * @param conn - the connection information
	 * @returns true if implemented, false otherwise
	 */
	virtual bool handleHead(CivetServer *server, struct mg_connection *conn);

	/**
	 * Callback method for HEAD request.
	 *
	 * @param server - the calling server
	 * @param conn - the connection information
	 * @param status_code - pointer to return status code
	 * @returns true if implemented, false otherwise
	 */
	virtual bool handleHead(CivetServer *server,
	                        struct mg_connection *conn,
	                        int *status_code);

	/**
	 * Callback method for PUT request.
	 *
	 * @param server - the calling server
	 * @param conn - the connection information
	 * @returns true if implemented, false otherwise
	 */
	virtual bool handlePut(CivetServer *server, struct mg_connection *conn);

	/**
	 * Callback method for PUT request.
	 *
	 * @param server - the calling server
	 * @param conn - the connection information
	 * @param status_code - pointer to return status code
	 * @returns true if implemented, false otherwise
	 */
	virtual bool handlePut(CivetServer *server,
	                       struct mg_connection *conn,
	                       int *status_code);

	/**
	 * Callback method for DELETE request.
	 *
	 * @param server - the calling server
	 * @param conn - the connection information
	 * @returns true if implemented, false otherwise
	 */
	virtual bool handleDelete(CivetServer *server, struct mg_connection *conn);

	/**
	 * Callback method for DELETE request.
	 *
	 * @param server - the calling server
	 * @param conn - the connection information
	 * @param status_code - pointer to return status code
	 * @returns true if implemented, false otherwise
	 */
	virtual bool handleDelete(CivetServer *server,
	                          struct mg_connection *conn,
	                          int *status_code);

	/**
	 * Callback method for OPTIONS request.
	 *
	 * @param server - the calling server
	 * @param conn - the connection information
	 * @returns true if implemented, false otherwise
	 */
	virtual bool handleOptions(CivetServer *server, struct mg_connection *conn);

	/**
	 * Callback method for OPTIONS request.
	 *
	 * @param server - the calling server
	 * @param conn - the connection information
	 * @param status_code - pointer to return status code
	 * @returns true if implemented, false otherwise
	 */
	virtual bool handleOptions(CivetServer *server,
	                           struct mg_connection *conn,
	                           int *status_code);

	/**
	 * Callback method for PATCH request.
	 *
	 * @param server - the calling server
	 * @param conn - the connection information
	 * @returns true if implemented, false otherwise
	 */
	virtual bool handlePatch(CivetServer *server, struct mg_connection *conn);

	/**
	 * Callback method for PATCH request.
	 *
	 * @param server - the calling server
	 * @param conn - the connection information
	 * @param status_code - pointer to return status code
	 * @returns true if implemented, false otherwise
	 */
	virtual bool handlePatch(CivetServer *server,
	                         struct mg_connection *conn,
	                         int *status_code);
}